

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-socket-buffer-size.c
# Opt level: O3

int run_test_socket_buffer_size(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  undefined1 local_18 [16];
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_18);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&tcp);
    if (iVar1 != 0) goto LAB_001be4d7;
    iVar1 = uv_tcp_bind(&tcp,local_18,0);
    if (iVar1 != 0) goto LAB_001be4e4;
    check_buffer_size((uv_handle_t *)&tcp);
    uv_close(&tcp,close_cb);
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init(uVar2,&udp);
    if (iVar1 != 0) goto LAB_001be4f1;
    iVar1 = uv_udp_bind(&udp,local_18,0);
    if (iVar1 != 0) goto LAB_001be4fe;
    check_buffer_size((uv_handle_t *)&udp);
    uv_close(&udp,close_cb);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_001be50b;
    if (close_cb_called == 2) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001be525;
    }
  }
  else {
    run_test_socket_buffer_size_cold_1();
LAB_001be4d7:
    run_test_socket_buffer_size_cold_2();
LAB_001be4e4:
    run_test_socket_buffer_size_cold_3();
LAB_001be4f1:
    run_test_socket_buffer_size_cold_4();
LAB_001be4fe:
    run_test_socket_buffer_size_cold_5();
LAB_001be50b:
    run_test_socket_buffer_size_cold_6();
  }
  run_test_socket_buffer_size_cold_7();
LAB_001be525:
  run_test_socket_buffer_size_cold_8();
  iVar1 = uv_recv_buffer_size();
  if (iVar1 != 0) {
    check_buffer_size_cold_1();
  }
  check_buffer_size_cold_2();
  check_buffer_size_cold_3();
  check_buffer_size_cold_4();
  check_buffer_size_cold_5();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(socket_buffer_size) {
  struct sockaddr_in addr;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &tcp));
  ASSERT_OK(uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &tcp);
  uv_close((uv_handle_t*) &tcp, close_cb);

  ASSERT_OK(uv_udp_init(uv_default_loop(), &udp));
  ASSERT_OK(uv_udp_bind(&udp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &udp);
  uv_close((uv_handle_t*) &udp, close_cb);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}